

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_adaptive_eval.h
# Opt level: O3

void __thiscall
embree::sse2::FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
          (FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *this,
          CatmullClarkPatch *patch,Vec2f *uv,float dscale,size_t depth,BezierCurve *border0,
          BezierCurve *border1,BezierCurve *border2,BezierCurve *border3)

{
  undefined8 *puVar1;
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *pDVar2;
  uint uVar3;
  undefined1 *puVar4;
  vfloat_impl<4> *pvVar5;
  vfloat_impl<4> *pvVar6;
  vfloat_impl<4> *pvVar7;
  vfloat_impl<4> *pvVar8;
  vfloat_impl<4> *pvVar9;
  vfloat_impl<4> *pvVar10;
  anon_union_8_2_4062524c_for_Vec2<float>_1 aVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  ulong uVar25;
  long *plVar26;
  long lVar27;
  long lVar28;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar29;
  ulong uVar30;
  long *plVar31;
  int iVar32;
  undefined1 *puVar33;
  undefined1 *puVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar47;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  float fVar55;
  float fVar59;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar60;
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar65;
  float fVar72;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar73;
  float fVar75;
  float fVar76;
  undefined1 auVar74 [16];
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL> patches;
  float local_3520;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3480;
  float local_3470;
  float fStack_346c;
  float fStack_3468;
  float fStack_3464;
  float local_3460;
  float fStack_345c;
  float fStack_3458;
  float fStack_3454;
  float local_3450;
  float fStack_344c;
  float fStack_3448;
  float fStack_3444;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3440;
  float local_3430;
  float fStack_342c;
  float fStack_3428;
  float fStack_3424;
  float local_3420;
  float fStack_341c;
  float fStack_3418;
  float fStack_3414;
  float local_3410;
  float fStack_340c;
  float fStack_3408;
  float fStack_3404;
  float local_3400;
  float fStack_33fc;
  float fStack_33f8;
  float fStack_33f4;
  float local_33f0;
  float fStack_33ec;
  float fStack_33e8;
  float fStack_33e4;
  float local_33e0;
  float fStack_33dc;
  float fStack_33d8;
  float fStack_33d4;
  float local_33d0;
  float fStack_33cc;
  float fStack_33c8;
  float fStack_33c4;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_33c0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_33b0;
  float local_33a0;
  float fStack_339c;
  float fStack_3398;
  float fStack_3394;
  float local_3390;
  float fStack_338c;
  float fStack_3388;
  float fStack_3384;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3380;
  float local_3370;
  float fStack_336c;
  float fStack_3368;
  float fStack_3364;
  float local_3360;
  float fStack_335c;
  float fStack_3358;
  float fStack_3354;
  float local_3350;
  float fStack_334c;
  float fStack_3348;
  float fStack_3344;
  long local_3180 [320];
  undefined8 local_2780 [8];
  DynamicStackArray<float,_16UL,_64UL> DStack_2740;
  undefined8 local_26c0 [8];
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> aDStack_2680 [5];
  undefined8 local_1a80 [8];
  DynamicStackArray<float,_16UL,_64UL> DStack_1a40;
  undefined8 local_19c0 [8];
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> aDStack_1980 [5];
  undefined8 local_d80 [8];
  DynamicStackArray<float,_16UL,_64UL> DStack_d40;
  undefined8 local_cc0 [8];
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> aDStack_c80 [4];
  undefined1 local_380 [768];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_80 [5];
  
  local_3520 = dscale;
  while( true ) {
    uVar3 = (patch->ring).items[0].face_valence;
    if ((ulong)uVar3 == 0) {
      uVar25 = 0;
    }
    else {
      uVar30 = 0;
      uVar25 = 0;
      do {
        uVar25 = uVar25 + (0.0 < (patch->ring).items[0].crease_weight.data[uVar30]);
        uVar30 = uVar30 + 1;
      } while (uVar3 != uVar30);
    }
    iVar32 = (patch->ring).items[0].border_index;
    bVar35 = uVar25 == (uint)(iVar32 != -1) * 2;
    bVar22 = true;
    fVar39 = (patch->ring).items[0].vertex_crease_weight;
    bVar21 = bVar35;
    bVar24 = bVar22;
    if (uVar3 == 2 && iVar32 != -1) {
      if (((fVar39 != 0.0) || (NAN(fVar39))) && (fVar39 < INFINITY)) {
        bVar21 = false;
        bVar24 = false;
      }
    }
    else {
      bVar21 = false;
      bVar24 = false;
      if (((fVar39 == 0.0) && (!NAN(fVar39))) &&
         (bVar21 = bVar35, bVar24 = bVar22, uVar3 != 3 || iVar32 == -1)) {
        bVar21 = (uVar3 == 4 && iVar32 == -1) && bVar35;
        bVar24 = uVar3 == 4 && iVar32 == -1;
      }
    }
    uVar3 = (patch->ring).items[1].face_valence;
    if ((ulong)uVar3 == 0) {
      uVar25 = 0;
    }
    else {
      uVar30 = 0;
      uVar25 = 0;
      do {
        uVar25 = uVar25 + (0.0 < (patch->ring).items[1].crease_weight.data[uVar30]);
        uVar30 = uVar30 + 1;
      } while (uVar3 != uVar30);
    }
    iVar32 = (patch->ring).items[1].border_index;
    bVar36 = uVar25 == (uint)(iVar32 != -1) * 2;
    bVar20 = true;
    fVar39 = (patch->ring).items[1].vertex_crease_weight;
    bVar22 = bVar36;
    bVar35 = bVar20;
    if (uVar3 == 2 && iVar32 != -1) {
      if (((fVar39 != 0.0) || (NAN(fVar39))) && (fVar39 < INFINITY)) {
        bVar22 = false;
        bVar35 = false;
      }
    }
    else {
      bVar22 = false;
      bVar35 = false;
      if (((fVar39 == 0.0) && (!NAN(fVar39))) &&
         (bVar22 = bVar36, bVar35 = bVar20, uVar3 != 3 || iVar32 == -1)) {
        bVar22 = (uVar3 == 4 && iVar32 == -1) && bVar36;
        bVar35 = uVar3 == 4 && iVar32 == -1;
      }
    }
    uVar3 = (patch->ring).items[2].face_valence;
    if ((ulong)uVar3 == 0) {
      uVar25 = 0;
    }
    else {
      uVar30 = 0;
      uVar25 = 0;
      do {
        uVar25 = uVar25 + (0.0 < (patch->ring).items[2].crease_weight.data[uVar30]);
        uVar30 = uVar30 + 1;
      } while (uVar3 != uVar30);
    }
    iVar32 = (patch->ring).items[2].border_index;
    bVar37 = uVar25 == (uint)(iVar32 != -1) * 2;
    bVar19 = true;
    fVar39 = (patch->ring).items[2].vertex_crease_weight;
    bVar20 = bVar37;
    bVar36 = bVar19;
    if (uVar3 == 2 && iVar32 != -1) {
      if (((fVar39 != 0.0) || (NAN(fVar39))) && (fVar39 < INFINITY)) {
        bVar20 = false;
        bVar36 = false;
      }
    }
    else {
      bVar20 = false;
      bVar36 = false;
      if (((fVar39 == 0.0) && (!NAN(fVar39))) &&
         (bVar20 = bVar37, bVar36 = bVar19, uVar3 != 3 || iVar32 == -1)) {
        bVar20 = (uVar3 == 4 && iVar32 == -1) && bVar37;
        bVar36 = uVar3 == 4 && iVar32 == -1;
      }
    }
    uVar3 = (patch->ring).items[3].face_valence;
    if ((ulong)uVar3 == 0) {
      uVar25 = 0;
    }
    else {
      uVar30 = 0;
      uVar25 = 0;
      do {
        uVar25 = uVar25 + (0.0 < (patch->ring).items[3].crease_weight.data[uVar30]);
        uVar30 = uVar30 + 1;
      } while (uVar3 != uVar30);
    }
    iVar32 = (patch->ring).items[3].border_index;
    bVar38 = uVar25 == (uint)(iVar32 != -1) * 2;
    bVar23 = true;
    fVar39 = (patch->ring).items[3].vertex_crease_weight;
    bVar19 = bVar38;
    bVar37 = bVar23;
    if (uVar3 == 2 && iVar32 != -1) {
      if (((fVar39 != 0.0) || (NAN(fVar39))) && (fVar39 < INFINITY)) {
        bVar19 = false;
        bVar37 = false;
      }
    }
    else {
      bVar19 = false;
      bVar37 = false;
      if (((fVar39 == 0.0) && (!NAN(fVar39))) &&
         (bVar19 = bVar38, bVar37 = bVar23, uVar3 != 3 || iVar32 == -1)) {
        bVar19 = (uVar3 == 4 && iVar32 == -1) && bVar38;
        bVar37 = uVar3 == 4 && iVar32 == -1;
      }
    }
    if (9 < depth) break;
    if ((bool)(bVar22 & bVar21 & bVar20 & bVar19)) goto LAB_00d4d965;
    plVar26 = local_3180;
    lVar27 = 0;
    do {
      lVar28 = 0xd00;
      plVar31 = plVar26;
      do {
        plVar31[-0x50] = (long)(plVar31 + -0x58);
        plVar31[-0x47] = 0;
        *plVar31 = (long)(plVar31 + -0x40);
        plVar31 = plVar31 + 0x68;
        lVar28 = lVar28 + -0x340;
      } while (lVar28 != 0);
      lVar27 = lVar27 + 0xd00;
      plVar26 = plVar26 + 0x1a0;
    } while (lVar27 != 0x3400);
    CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::subdivide
              (patch,(array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
                      *)&local_3480);
    fVar39 = (uv->field_0).field_0.x;
    fVar42 = (uv->field_0).field_0.y;
    if (0.5 <= fVar42) {
      if (fVar39 <= 0.5) {
        lVar27 = 0;
        do {
          uVar18 = *(undefined8 *)((long)local_d80 + lVar27 + 8);
          puVar1 = (undefined8 *)((long)(patch->ring).items[0].crease_weight.arr + lVar27 + -0x40);
          *puVar1 = *(undefined8 *)((long)local_d80 + lVar27);
          puVar1[1] = uVar18;
          DynamicStackArray<float,_16UL,_64UL>::operator=
                    ((DynamicStackArray<float,_16UL,_64UL> *)(puVar1 + 8),
                     (DynamicStackArray<float,_16UL,_64UL> *)((long)DStack_d40.arr + lVar27));
          uVar18 = *(undefined8 *)((long)local_cc0 + lVar27 + 8);
          pDVar2 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                   ((long)&(patch->ring).items[0].ring.arr[0].field_0 + lVar27);
          pDVar2[-1].data = *(vfloat_impl<4> **)((long)local_cc0 + lVar27);
          *(undefined8 *)&pDVar2[-1].field_0x208 = uVar18;
          uVar18 = *(undefined8 *)((long)local_cc0 + lVar27 + 0x18);
          *(undefined8 *)&pDVar2[-1].field_0x210 = *(undefined8 *)((long)local_cc0 + lVar27 + 0x10);
          *(undefined8 *)&pDVar2[-1].field_0x218 = uVar18;
          DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL>::operator=
                    (pDVar2,(DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                            ((long)&aDStack_c80[0].arr[0].field_0 + lVar27));
          lVar27 = lVar27 + 0x340;
        } while (lVar27 != 0xd00);
        fVar39 = fVar39 + fVar39;
        fVar42 = fVar42 + fVar42 + -1.0;
      }
      else {
        lVar27 = 0;
        do {
          uVar18 = *(undefined8 *)((long)local_1a80 + lVar27 + 8);
          puVar1 = (undefined8 *)((long)(patch->ring).items[0].crease_weight.arr + lVar27 + -0x40);
          *puVar1 = *(undefined8 *)((long)local_1a80 + lVar27);
          puVar1[1] = uVar18;
          DynamicStackArray<float,_16UL,_64UL>::operator=
                    ((DynamicStackArray<float,_16UL,_64UL> *)(puVar1 + 8),
                     (DynamicStackArray<float,_16UL,_64UL> *)((long)DStack_1a40.arr + lVar27));
          uVar18 = *(undefined8 *)((long)local_19c0 + lVar27 + 8);
          pDVar2 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                   ((long)&(patch->ring).items[0].ring.arr[0].field_0 + lVar27);
          pDVar2[-1].data = *(vfloat_impl<4> **)((long)local_19c0 + lVar27);
          *(undefined8 *)&pDVar2[-1].field_0x208 = uVar18;
          uVar18 = *(undefined8 *)((long)local_19c0 + lVar27 + 0x18);
          *(undefined8 *)&pDVar2[-1].field_0x210 = *(undefined8 *)((long)local_19c0 + lVar27 + 0x10)
          ;
          *(undefined8 *)&pDVar2[-1].field_0x218 = uVar18;
          DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL>::operator=
                    (pDVar2,(DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                            ((long)&aDStack_1980[0].arr[0].field_0 + lVar27));
          lVar27 = lVar27 + 0x340;
        } while (lVar27 != 0xd00);
        fVar39 = fVar39 + fVar39 + -1.0;
        fVar42 = fVar42 + fVar42 + -1.0;
      }
    }
    else if (0.5 <= fVar39) {
      lVar27 = 0;
      do {
        uVar18 = *(undefined8 *)((long)local_2780 + lVar27 + 8);
        puVar1 = (undefined8 *)((long)(patch->ring).items[0].crease_weight.arr + lVar27 + -0x40);
        *puVar1 = *(undefined8 *)((long)local_2780 + lVar27);
        puVar1[1] = uVar18;
        DynamicStackArray<float,_16UL,_64UL>::operator=
                  ((DynamicStackArray<float,_16UL,_64UL> *)(puVar1 + 8),
                   (DynamicStackArray<float,_16UL,_64UL> *)((long)DStack_2740.arr + lVar27));
        uVar18 = *(undefined8 *)((long)local_26c0 + lVar27 + 8);
        pDVar2 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                 ((long)&(patch->ring).items[0].ring.arr[0].field_0 + lVar27);
        pDVar2[-1].data = *(vfloat_impl<4> **)((long)local_26c0 + lVar27);
        *(undefined8 *)&pDVar2[-1].field_0x208 = uVar18;
        uVar18 = *(undefined8 *)((long)local_26c0 + lVar27 + 0x18);
        *(undefined8 *)&pDVar2[-1].field_0x210 = *(undefined8 *)((long)local_26c0 + lVar27 + 0x10);
        *(undefined8 *)&pDVar2[-1].field_0x218 = uVar18;
        DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL>::operator=
                  (pDVar2,(DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                          ((long)&aDStack_2680[0].arr[0].field_0 + lVar27));
        lVar27 = lVar27 + 0x340;
      } while (lVar27 != 0xd00);
      fVar39 = fVar39 + fVar39 + -1.0;
      fVar42 = fVar42 + fVar42;
    }
    else {
      lVar27 = 0;
      do {
        uVar18 = *(undefined8 *)((long)&local_3480 + lVar27 + 8);
        puVar1 = (undefined8 *)((long)(patch->ring).items[0].crease_weight.arr + lVar27 + -0x40);
        *puVar1 = *(undefined8 *)((long)&local_3480 + lVar27);
        puVar1[1] = uVar18;
        DynamicStackArray<float,_16UL,_64UL>::operator=
                  ((DynamicStackArray<float,_16UL,_64UL> *)(puVar1 + 8),
                   (DynamicStackArray<float,_16UL,_64UL> *)((long)&local_3440 + lVar27));
        uVar18 = *(undefined8 *)((long)&local_33c0 + lVar27 + 8);
        puVar1 = (undefined8 *)((long)((patch->ring).items[0].ring.arr + -4) + lVar27);
        *puVar1 = *(undefined8 *)((long)&local_33c0 + lVar27);
        puVar1[1] = uVar18;
        uVar18 = *(undefined8 *)((long)&local_33b0 + lVar27 + 8);
        puVar1 = (undefined8 *)((long)((patch->ring).items[0].ring.arr + -3) + lVar27);
        *puVar1 = *(undefined8 *)((long)&local_33b0 + lVar27);
        puVar1[1] = uVar18;
        DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL>::operator=
                  ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                   ((long)&(patch->ring).items[0].ring.arr[0].field_0 + lVar27),
                   (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                   ((long)&local_3380 + lVar27));
        lVar27 = lVar27 + 0x340;
      } while (lVar27 != 0xd00);
      fVar39 = fVar39 + fVar39;
      fVar42 = fVar42 + fVar42;
    }
    aVar11.field_0.y = fVar42;
    aVar11.field_0.x = fVar39;
    uv->field_0 = aVar11;
    local_3520 = local_3520 + local_3520;
    depth = depth + 1;
    puVar34 = local_380;
    paVar29 = local_80;
    do {
      paVar29 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(paVar29->v + -0x340);
      lVar27 = -0xd00;
      puVar33 = puVar34;
      do {
        puVar4 = *(undefined1 **)(puVar33 + 0x2c0);
        if (puVar4 != (undefined1 *)0x0 && puVar33 + 0xc0 != puVar4) {
          alignedFree(puVar4);
        }
        puVar4 = *(undefined1 **)(puVar33 + 0x40);
        if (puVar4 != (undefined1 *)0x0 && puVar33 != puVar4) {
          operator_delete__(puVar4);
        }
        puVar33 = puVar33 + -0x340;
        lVar27 = lVar27 + 0x340;
      } while (lVar27 != 0);
      puVar34 = puVar34 + -0xd00;
    } while (paVar29 != &local_3480);
  }
  if (!(bool)(bVar35 & bVar24 & bVar36 & bVar37)) {
    GregoryPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::init_crackfix
              ((GregoryPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_3480,patch,
               border0,border1,border2,border3);
    fVar39 = (uv->field_0).field_0.x;
    fVar42 = (uv->field_0).field_0.y;
    pvVar5 = this->P;
    pvVar6 = this->dPdu;
    pvVar7 = this->dPdv;
    pvVar8 = this->ddPdudu;
    pvVar9 = this->ddPdvdv;
    pvVar10 = this->ddPdudv;
    if (pvVar5 != (vfloat_impl<4> *)0x0) {
      auVar46._4_4_ = -(uint)(fVar42 == 0.0);
      auVar46._0_4_ = -(uint)(fVar39 == 0.0);
      auVar46._8_4_ = -(uint)(fVar39 == 1.0);
      auVar46._12_4_ = -(uint)(fVar42 == 1.0);
      iVar32 = movmskps((int)border3,auVar46);
      fVar40 = local_3420;
      fVar55 = fStack_341c;
      fVar59 = fStack_3418;
      fVar44 = fStack_3414;
      fVar85 = local_33e0;
      fVar91 = fStack_33dc;
      fVar92 = fStack_33d8;
      fVar48 = fStack_33d4;
      fVar64 = local_33f0;
      fVar47 = fStack_33ec;
      fVar54 = fStack_33e8;
      fVar60 = fStack_33e4;
      fVar72 = local_3430;
      fVar75 = fStack_342c;
      fVar76 = fStack_3428;
      fVar65 = fStack_3424;
      if (iVar32 == 0) {
        fVar40 = fVar39 + fVar42;
        auVar45._4_4_ = fVar42;
        auVar45._0_4_ = fVar40;
        auVar45._8_8_ = 0;
        auVar12._4_4_ = fVar42;
        auVar12._0_4_ = fVar40;
        auVar12._8_8_ = 0;
        auVar46 = rcpss(auVar45,auVar12);
        fVar60 = (2.0 - fVar40 * auVar46._0_4_) * auVar46._0_4_;
        fVar64 = 1.0 - fVar39;
        fVar72 = 1.0 - fVar42;
        fVar40 = fVar64 + fVar42;
        auVar74._4_4_ = fVar72;
        auVar74._0_4_ = fVar40;
        auVar74._8_8_ = 0;
        auVar13._4_4_ = fVar72;
        auVar13._0_4_ = fVar40;
        auVar13._8_8_ = 0;
        auVar46 = rcpss(auVar74,auVar13);
        fVar44 = (2.0 - fVar40 * auVar46._0_4_) * auVar46._0_4_;
        fVar40 = (2.0 - fVar39) - fVar42;
        auVar46 = rcpss(ZEXT416((uint)fVar40),ZEXT416((uint)fVar40));
        fVar48 = (2.0 - fVar40 * auVar46._0_4_) * auVar46._0_4_;
        fVar40 = (fVar39 + 1.0) - fVar42;
        auVar46 = rcpss(ZEXT416((uint)fVar40),ZEXT416((uint)fVar40));
        fVar54 = (2.0 - fVar40 * auVar46._0_4_) * auVar46._0_4_;
        fVar40 = fVar44 * (local_3370 * fVar64 + local_3420 * fVar42);
        fVar55 = fVar44 * (fStack_336c * fVar64 + fStack_341c * fVar42);
        fVar59 = fVar44 * (fStack_3368 * fVar64 + fStack_3418 * fVar42);
        fVar44 = fVar44 * (fStack_3364 * fVar64 + fStack_3414 * fVar42);
        fVar85 = fVar48 * (local_3350 * fVar72 + fVar64 * local_33e0);
        fVar91 = fVar48 * (fStack_334c * fVar72 + fVar64 * fStack_33dc);
        fVar92 = fVar48 * (fStack_3348 * fVar72 + fVar64 * fStack_33d8);
        fVar48 = fVar48 * (fStack_3344 * fVar72 + fVar64 * fStack_33d4);
        fVar64 = fVar54 * (fVar72 * local_33f0 + local_3360 * fVar39);
        fVar47 = fVar54 * (fVar72 * fStack_33ec + fStack_335c * fVar39);
        fVar54 = fVar54 * (fVar72 * fStack_33e8 + fStack_3358 * fVar39);
        fVar60 = fVar54 * (fVar72 * fStack_33e4 + fStack_3354 * fVar39);
        fVar72 = fVar60 * (local_3380.v[0] * fVar42 + local_3430 * fVar39);
        fVar75 = fVar60 * (local_3380.v[1] * fVar42 + fStack_342c * fVar39);
        fVar76 = fVar60 * (local_3380.v[2] * fVar42 + fStack_3428 * fVar39);
        fVar65 = fVar60 * (local_3380.v[3] * fVar42 + fStack_3424 * fVar39);
      }
      fVar43 = 1.0 - fVar42;
      fVar73 = 1.0 - fVar39;
      fVar77 = fVar39 * 3.0 * fVar73 * fVar73;
      fVar41 = fVar39 * fVar39 * 3.0 * fVar73;
      fVar80 = fVar42 * fVar42 * 3.0 * fVar43;
      fVar86 = fVar43 * fVar43 * fVar43;
      fVar43 = fVar42 * 3.0 * fVar43 * fVar43;
      fVar78 = fVar42 * fVar42 * fVar42;
      fVar73 = fVar73 * fVar73 * fVar73;
      fVar84 = fVar39 * fVar39 * fVar39;
      (pvVar5->field_0).v[0] =
           fVar78 * (fVar73 * local_33c0.v[0] +
                    fVar77 * local_33b0.v[0] + fVar41 * local_33a0 + fVar84 * local_3390) +
           (local_3400 * fVar73 + fVar64 * fVar77 + fVar85 * fVar41 + local_33d0 * fVar84) * fVar80
           + (local_3440.v[0] * fVar73 + fVar72 * fVar77 + fVar40 * fVar41 + local_3410 * fVar84) *
             fVar43 +
           (local_3480.v[0] * fVar73 +
           local_3470 * fVar77 + local_3460 * fVar41 + local_3450 * fVar84) * fVar86;
      (pvVar5->field_0).v[1] =
           fVar78 * (fVar73 * local_33c0.v[1] +
                    fVar77 * local_33b0.v[1] + fVar41 * fStack_339c + fVar84 * fStack_338c) +
           (fStack_33fc * fVar73 + fVar47 * fVar77 + fVar91 * fVar41 + fStack_33cc * fVar84) *
           fVar80 + (local_3440.v[1] * fVar73 +
                    fVar75 * fVar77 + fVar55 * fVar41 + fStack_340c * fVar84) * fVar43 +
           (local_3480.v[1] * fVar73 +
           fStack_346c * fVar77 + fStack_345c * fVar41 + fStack_344c * fVar84) * fVar86;
      (pvVar5->field_0).v[2] =
           fVar78 * (fVar73 * local_33c0.v[2] +
                    fVar77 * local_33b0.v[2] + fVar41 * fStack_3398 + fVar84 * fStack_3388) +
           (fStack_33f8 * fVar73 + fVar54 * fVar77 + fVar92 * fVar41 + fStack_33c8 * fVar84) *
           fVar80 + (local_3440.v[2] * fVar73 +
                    fVar76 * fVar77 + fVar59 * fVar41 + fStack_3408 * fVar84) * fVar43 +
           (local_3480.v[2] * fVar73 +
           fStack_3468 * fVar77 + fStack_3458 * fVar41 + fStack_3448 * fVar84) * fVar86;
      (pvVar5->field_0).v[3] =
           fVar78 * (fVar73 * local_33c0.v[3] +
                    fVar77 * local_33b0.v[3] + fVar41 * fStack_3394 + fVar84 * fStack_3384) +
           (fStack_33f4 * fVar73 + fVar60 * fVar77 + fVar48 * fVar41 + fStack_33c4 * fVar84) *
           fVar80 + (local_3440.v[3] * fVar73 +
                    fVar65 * fVar77 + fVar44 * fVar41 + fStack_3404 * fVar84) * fVar43 +
           (local_3480.v[3] * fVar73 +
           fStack_3464 * fVar77 + fStack_3454 * fVar41 + fStack_3444 * fVar84) * fVar86;
    }
    if (pvVar6 != (vfloat_impl<4> *)0x0) {
      auVar14._4_4_ = -(uint)(fVar42 == 0.0);
      auVar14._0_4_ = -(uint)(fVar39 == 0.0);
      auVar14._8_4_ = -(uint)(fVar39 == 1.0);
      auVar14._12_4_ = -(uint)(fVar42 == 1.0);
      iVar32 = movmskps((int)pvVar5,auVar14);
      fVar40 = local_3420;
      fVar55 = fStack_341c;
      fVar59 = fStack_3418;
      fVar44 = fStack_3414;
      fVar85 = local_33e0;
      fVar91 = fStack_33dc;
      fVar92 = fStack_33d8;
      fVar48 = fStack_33d4;
      fVar64 = local_33f0;
      fVar47 = fStack_33ec;
      fVar54 = fStack_33e8;
      fVar60 = fStack_33e4;
      fVar72 = local_3430;
      fVar75 = fStack_342c;
      fVar76 = fStack_3428;
      fVar65 = fStack_3424;
      if (iVar32 == 0) {
        auVar49._0_4_ = fVar39 + fVar42;
        auVar49._4_4_ = fVar42;
        auVar49._8_8_ = 0;
        auVar62._4_4_ = fVar42;
        auVar62._0_4_ = auVar49._0_4_;
        auVar62._8_8_ = 0;
        auVar46 = rcpss(auVar62,auVar49);
        fVar55 = 1.0 - fVar39;
        fVar59 = 1.0 - fVar42;
        fVar91 = (2.0 - auVar49._0_4_ * auVar46._0_4_) * auVar46._0_4_;
        auVar63._0_4_ = fVar55 + fVar42;
        auVar63._4_4_ = fVar59;
        auVar63._8_8_ = 0;
        auVar66._4_4_ = fVar59;
        auVar66._0_4_ = auVar63._0_4_;
        auVar66._8_8_ = 0;
        auVar46 = rcpss(auVar66,auVar63);
        fVar44 = (2.0 - auVar63._0_4_ * auVar46._0_4_) * auVar46._0_4_;
        fVar40 = (2.0 - fVar39) - fVar42;
        auVar46 = rcpss(ZEXT416((uint)fVar40),ZEXT416((uint)fVar40));
        fVar85 = (2.0 - fVar40 * auVar46._0_4_) * auVar46._0_4_;
        fVar40 = (fVar39 + 1.0) - fVar42;
        auVar46 = rcpss(ZEXT416((uint)fVar40),ZEXT416((uint)fVar40));
        fVar40 = (2.0 - fVar40 * auVar46._0_4_) * auVar46._0_4_;
        fVar40 = fVar44 * (local_3370 * fVar55 + local_3420 * fVar42);
        fVar55 = fVar44 * (fStack_336c * fVar55 + fStack_341c * fVar42);
        fVar59 = fVar44 * (fStack_3368 * fVar55 + fStack_3418 * fVar42);
        fVar44 = fVar44 * (fStack_3364 * fVar55 + fStack_3414 * fVar42);
        fVar85 = fVar85 * (local_3350 * fVar59 + fVar55 * local_33e0);
        fVar91 = fVar85 * (fStack_334c * fVar59 + fVar55 * fStack_33dc);
        fVar92 = fVar85 * (fStack_3348 * fVar59 + fVar55 * fStack_33d8);
        fVar48 = fVar85 * (fStack_3344 * fVar59 + fVar55 * fStack_33d4);
        fVar64 = fVar40 * (fVar59 * local_33f0 + local_3360 * fVar39);
        fVar47 = fVar40 * (fVar59 * fStack_33ec + fStack_335c * fVar39);
        fVar54 = fVar40 * (fVar59 * fStack_33e8 + fStack_3358 * fVar39);
        fVar60 = fVar40 * (fVar59 * fStack_33e4 + fStack_3354 * fVar39);
        fVar72 = fVar91 * (local_3380.v[0] * fVar42 + local_3430 * fVar39);
        fVar75 = fVar91 * (local_3380.v[1] * fVar42 + fStack_342c * fVar39);
        fVar76 = fVar91 * (local_3380.v[2] * fVar42 + fStack_3428 * fVar39);
        fVar65 = fVar91 * (local_3380.v[3] * fVar42 + fStack_3424 * fVar39);
      }
      fVar80 = 1.0 - fVar39;
      fVar84 = 1.0 - fVar42;
      fVar41 = fVar80 * fVar80;
      fVar43 = fVar39 * fVar80 + fVar39 * fVar80;
      fVar86 = fVar39 * fVar39;
      fVar81 = fVar41 * -3.0;
      fVar78 = (fVar41 - fVar43) * 3.0;
      fVar73 = (fVar43 - fVar86) * 3.0;
      fVar61 = fVar86 * 3.0;
      fVar87 = fVar84 * fVar84;
      fVar43 = fVar84 * fVar87;
      fVar93 = fVar42 * 3.0 * fVar87;
      fVar88 = fVar42 * fVar42;
      fVar79 = fVar88 * 3.0;
      fVar89 = fVar84 * fVar79;
      fVar77 = fVar42 * fVar88;
      (pvVar6->field_0).v[0] =
           (fVar77 * (fVar81 * local_33c0.v[0] +
                     fVar78 * local_33b0.v[0] + fVar73 * local_33a0 + fVar61 * local_3390) +
            (local_3400 * fVar81 + fVar64 * fVar78 + fVar85 * fVar73 + local_33d0 * fVar61) * fVar89
            + (local_3440.v[0] * fVar81 + fVar72 * fVar78 + fVar40 * fVar73 + local_3410 * fVar61) *
              fVar93 +
           (local_3480.v[0] * fVar81 +
           local_3470 * fVar78 + local_3460 * fVar73 + local_3450 * fVar61) * fVar43) * local_3520;
      (pvVar6->field_0).v[1] =
           (fVar77 * (fVar81 * local_33c0.v[1] +
                     fVar78 * local_33b0.v[1] + fVar73 * fStack_339c + fVar61 * fStack_338c) +
            (fStack_33fc * fVar81 + fVar47 * fVar78 + fVar91 * fVar73 + fStack_33cc * fVar61) *
            fVar89 + (local_3440.v[1] * fVar81 +
                     fVar75 * fVar78 + fVar55 * fVar73 + fStack_340c * fVar61) * fVar93 +
           (local_3480.v[1] * fVar81 +
           fStack_346c * fVar78 + fStack_345c * fVar73 + fStack_344c * fVar61) * fVar43) *
           local_3520;
      (pvVar6->field_0).v[2] =
           (fVar77 * (fVar81 * local_33c0.v[2] +
                     fVar78 * local_33b0.v[2] + fVar73 * fStack_3398 + fVar61 * fStack_3388) +
            (fStack_33f8 * fVar81 + fVar54 * fVar78 + fVar92 * fVar73 + fStack_33c8 * fVar61) *
            fVar89 + (local_3440.v[2] * fVar81 +
                     fVar76 * fVar78 + fVar59 * fVar73 + fStack_3408 * fVar61) * fVar93 +
           (local_3480.v[2] * fVar81 +
           fStack_3468 * fVar78 + fStack_3458 * fVar73 + fStack_3448 * fVar61) * fVar43) *
           local_3520;
      (pvVar6->field_0).v[3] =
           (fVar77 * (fVar81 * local_33c0.v[3] +
                     fVar78 * local_33b0.v[3] + fVar73 * fStack_3394 + fVar61 * fStack_3384) +
            (fStack_33f4 * fVar81 + fVar60 * fVar78 + fVar48 * fVar73 + fStack_33c4 * fVar61) *
            fVar89 + (local_3440.v[3] * fVar81 +
                     fVar65 * fVar78 + fVar44 * fVar73 + fStack_3404 * fVar61) * fVar93 +
           (local_3480.v[3] * fVar81 +
           fStack_3464 * fVar78 + fStack_3454 * fVar73 + fStack_3444 * fVar61) * fVar43) *
           local_3520;
      fVar40 = local_33f0;
      fVar55 = fStack_33ec;
      fVar59 = fStack_33e8;
      fVar44 = fStack_33e4;
      fVar85 = local_33e0;
      fVar91 = fStack_33dc;
      fVar92 = fStack_33d8;
      fVar48 = fStack_33d4;
      fVar64 = local_3430;
      fVar47 = fStack_342c;
      fVar54 = fStack_3428;
      fVar60 = fStack_3424;
      fVar72 = local_3420;
      fVar75 = fStack_341c;
      fVar76 = fStack_3418;
      fVar65 = fStack_3414;
      if ((char)iVar32 == '\0') {
        auVar67._0_4_ = fVar39 + fVar42;
        auVar67._4_4_ = fVar42;
        auVar67._8_8_ = 0;
        auVar82._4_4_ = fVar42;
        auVar82._0_4_ = auVar67._0_4_;
        auVar82._8_8_ = 0;
        auVar46 = rcpss(auVar82,auVar67);
        fVar91 = (2.0 - auVar67._0_4_ * auVar46._0_4_) * auVar46._0_4_;
        auVar68._0_4_ = fVar80 + fVar42;
        auVar68._4_4_ = fVar84;
        auVar68._8_8_ = 0;
        auVar83._4_4_ = fVar84;
        auVar83._0_4_ = auVar68._0_4_;
        auVar83._8_8_ = 0;
        auVar46 = rcpss(auVar83,auVar68);
        fVar48 = (2.0 - auVar68._0_4_ * auVar46._0_4_) * auVar46._0_4_;
        fVar40 = (2.0 - fVar39) - fVar42;
        auVar46 = rcpss(ZEXT416((uint)fVar40),ZEXT416((uint)fVar40));
        fVar92 = (2.0 - fVar40 * auVar46._0_4_) * auVar46._0_4_;
        fVar40 = (fVar39 + 1.0) - fVar42;
        auVar46 = rcpss(ZEXT416((uint)fVar40),ZEXT416((uint)fVar40));
        fVar44 = (2.0 - fVar40 * auVar46._0_4_) * auVar46._0_4_;
        fVar40 = (local_33f0 * fVar84 + local_3360 * fVar39) * fVar44;
        fVar55 = (fStack_33ec * fVar84 + fStack_335c * fVar39) * fVar44;
        fVar59 = (fStack_33e8 * fVar84 + fStack_3358 * fVar39) * fVar44;
        fVar44 = (fStack_33e4 * fVar84 + fStack_3354 * fVar39) * fVar44;
        fVar85 = fVar92 * (local_3350 * fVar84 + fVar80 * local_33e0);
        fVar91 = fVar92 * (fStack_334c * fVar84 + fVar80 * fStack_33dc);
        fVar92 = fVar92 * (fStack_3348 * fVar84 + fVar80 * fStack_33d8);
        fVar48 = fVar92 * (fStack_3344 * fVar84 + fVar80 * fStack_33d4);
        fVar64 = fVar91 * (local_3380.v[0] * fVar42 + local_3430 * fVar39);
        fVar47 = fVar91 * (local_3380.v[1] * fVar42 + fStack_342c * fVar39);
        fVar54 = fVar91 * (local_3380.v[2] * fVar42 + fStack_3428 * fVar39);
        fVar60 = fVar91 * (local_3380.v[3] * fVar42 + fStack_3424 * fVar39);
        fVar72 = (local_3420 * fVar42 + local_3370 * fVar80) * fVar48;
        fVar75 = (fStack_341c * fVar42 + fStack_336c * fVar80) * fVar48;
        fVar76 = (fStack_3418 * fVar42 + fStack_3368 * fVar80) * fVar48;
        fVar65 = (fStack_3414 * fVar42 + fStack_3364 * fVar80) * fVar48;
      }
      fVar77 = fVar42 * fVar84 + fVar42 * fVar84;
      fVar43 = fVar39 * 3.0 * fVar41;
      fVar61 = fVar61 * fVar80;
      fVar73 = (fVar87 - fVar77) * 3.0;
      fVar77 = (fVar77 - fVar88) * 3.0;
      fVar80 = fVar80 * fVar41;
      fVar86 = fVar86 * fVar39;
      fVar87 = fVar87 * -3.0;
      (pvVar7->field_0).v[0] =
           local_3520 *
           (fVar79 * (fVar80 * local_33c0.v[0] +
                     fVar43 * local_33b0.v[0] + fVar61 * local_33a0 + fVar86 * local_3390) +
            (local_3400 * fVar80 + fVar40 * fVar43 + fVar85 * fVar61 + local_33d0 * fVar86) * fVar77
            + (local_3440.v[0] * fVar80 + fVar64 * fVar43 + fVar72 * fVar61 + local_3410 * fVar86) *
              fVar73 +
           (local_3480.v[0] * fVar80 +
           local_3470 * fVar43 + local_3460 * fVar61 + local_3450 * fVar86) * fVar87);
      (pvVar7->field_0).v[1] =
           local_3520 *
           (fVar79 * (fVar80 * local_33c0.v[1] +
                     fVar43 * local_33b0.v[1] + fVar61 * fStack_339c + fVar86 * fStack_338c) +
            (fStack_33fc * fVar80 + fVar55 * fVar43 + fVar91 * fVar61 + fStack_33cc * fVar86) *
            fVar77 + (local_3440.v[1] * fVar80 +
                     fVar47 * fVar43 + fVar75 * fVar61 + fStack_340c * fVar86) * fVar73 +
           (local_3480.v[1] * fVar80 +
           fStack_346c * fVar43 + fStack_345c * fVar61 + fStack_344c * fVar86) * fVar87);
      (pvVar7->field_0).v[2] =
           local_3520 *
           (fVar79 * (fVar80 * local_33c0.v[2] +
                     fVar43 * local_33b0.v[2] + fVar61 * fStack_3398 + fVar86 * fStack_3388) +
            (fStack_33f8 * fVar80 + fVar59 * fVar43 + fVar92 * fVar61 + fStack_33c8 * fVar86) *
            fVar77 + (local_3440.v[2] * fVar80 +
                     fVar54 * fVar43 + fVar76 * fVar61 + fStack_3408 * fVar86) * fVar73 +
           (local_3480.v[2] * fVar80 +
           fStack_3468 * fVar43 + fStack_3458 * fVar61 + fStack_3448 * fVar86) * fVar87);
      (pvVar7->field_0).v[3] =
           local_3520 *
           (fVar79 * (fVar80 * local_33c0.v[3] +
                     fVar43 * local_33b0.v[3] + fVar61 * fStack_3394 + fVar86 * fStack_3384) +
            (fStack_33f4 * fVar80 + fVar44 * fVar43 + fVar48 * fVar61 + fStack_33c4 * fVar86) *
            fVar77 + (local_3440.v[3] * fVar80 +
                     fVar60 * fVar43 + fVar65 * fVar61 + fStack_3404 * fVar86) * fVar73 +
           (local_3480.v[3] * fVar80 +
           fStack_3464 * fVar43 + fStack_3454 * fVar61 + fStack_3444 * fVar86) * fVar87);
    }
    if (pvVar8 == (vfloat_impl<4> *)0x0) {
      return;
    }
    auVar15._4_4_ = -(uint)(fVar42 == 0.0);
    auVar15._0_4_ = -(uint)(fVar39 == 0.0);
    auVar15._8_4_ = -(uint)(fVar39 == 1.0);
    auVar15._12_4_ = -(uint)(fVar42 == 1.0);
    iVar32 = movmskps((int)pvVar7,auVar15);
    fVar40 = local_33f0;
    fVar55 = fStack_33ec;
    fVar59 = fStack_33e8;
    fVar44 = fStack_33e4;
    fVar85 = local_3430;
    fVar91 = fStack_342c;
    fVar92 = fStack_3428;
    fVar48 = fStack_3424;
    fVar64 = local_3420;
    fVar47 = fStack_341c;
    fVar54 = fStack_3418;
    fVar60 = fStack_3414;
    fVar72 = local_33e0;
    fVar75 = fStack_33dc;
    fVar76 = fStack_33d8;
    fVar65 = fStack_33d4;
    if (iVar32 == 0) {
      auVar56._0_4_ = fVar39 + fVar42;
      auVar56._4_4_ = fVar42;
      auVar56._8_8_ = 0;
      auVar69._4_4_ = fVar42;
      auVar69._0_4_ = auVar56._0_4_;
      auVar69._8_8_ = 0;
      auVar46 = rcpss(auVar69,auVar56);
      fVar85 = 1.0 - fVar39;
      fVar91 = 1.0 - fVar42;
      fVar55 = (2.0 - auVar56._0_4_ * auVar46._0_4_) * auVar46._0_4_;
      auVar57._0_4_ = fVar85 + fVar42;
      auVar57._4_4_ = fVar91;
      auVar57._8_8_ = 0;
      auVar70._4_4_ = fVar91;
      auVar70._0_4_ = auVar57._0_4_;
      auVar70._8_8_ = 0;
      auVar46 = rcpss(auVar70,auVar57);
      fVar59 = (2.0 - auVar57._0_4_ * auVar46._0_4_) * auVar46._0_4_;
      fVar40 = (2.0 - fVar39) - fVar42;
      auVar46 = rcpss(ZEXT416((uint)fVar40),ZEXT416((uint)fVar40));
      fVar44 = (2.0 - fVar40 * auVar46._0_4_) * auVar46._0_4_;
      fVar40 = (fVar39 + 1.0) - fVar42;
      auVar46 = rcpss(ZEXT416((uint)fVar40),ZEXT416((uint)fVar40));
      fVar40 = (2.0 - fVar40 * auVar46._0_4_) * auVar46._0_4_;
      fVar40 = fVar40 * (fVar91 * local_33f0 + local_3360 * fVar39);
      fVar55 = fVar40 * (fVar91 * fStack_33ec + fStack_335c * fVar39);
      fVar59 = fVar40 * (fVar91 * fStack_33e8 + fStack_3358 * fVar39);
      fVar44 = fVar40 * (fVar91 * fStack_33e4 + fStack_3354 * fVar39);
      fVar85 = fVar55 * (local_3380.v[0] * fVar42 + local_3430 * fVar39);
      fVar91 = fVar55 * (local_3380.v[1] * fVar42 + fStack_342c * fVar39);
      fVar92 = fVar55 * (local_3380.v[2] * fVar42 + fStack_3428 * fVar39);
      fVar48 = fVar55 * (local_3380.v[3] * fVar42 + fStack_3424 * fVar39);
      fVar64 = (local_3420 * fVar42 + local_3370 * fVar85) * fVar59;
      fVar47 = (fStack_341c * fVar42 + fStack_336c * fVar85) * fVar59;
      fVar54 = (fStack_3418 * fVar42 + fStack_3368 * fVar85) * fVar59;
      fVar60 = (fStack_3414 * fVar42 + fStack_3364 * fVar85) * fVar59;
      fVar72 = fVar44 * (local_3350 * fVar91 + fVar85 * local_33e0);
      fVar75 = fVar44 * (fStack_334c * fVar91 + fVar85 * fStack_33dc);
      fVar76 = fVar44 * (fStack_3348 * fVar91 + fVar85 * fStack_33d8);
      fVar65 = fVar44 * (fStack_3344 * fVar91 + fVar85 * fStack_33d4);
    }
    fVar81 = 1.0 - fVar42;
    fVar87 = 1.0 - fVar39;
    fVar79 = fVar87 * 6.0;
    fVar86 = (fVar39 - (fVar87 + fVar87)) * 6.0;
    fVar88 = (fVar87 - (fVar39 + fVar39)) * 6.0;
    fVar41 = fVar39 * 6.0;
    fVar77 = fVar81 * fVar81;
    fVar73 = fVar81 * fVar77;
    fVar80 = fVar42 * 3.0 * fVar77;
    fVar61 = fVar42 * fVar42;
    fVar78 = fVar61 * 3.0;
    fVar84 = fVar81 * fVar78;
    fVar43 = fVar42 * fVar61;
    local_3520 = local_3520 * local_3520;
    (pvVar8->field_0).v[0] =
         (fVar43 * (fVar79 * local_33c0.v[0] +
                   fVar86 * local_33b0.v[0] + fVar88 * local_33a0 + fVar41 * local_3390) +
          (local_3400 * fVar79 + fVar40 * fVar86 + fVar72 * fVar88 + local_33d0 * fVar41) * fVar84 +
          (local_3440.v[0] * fVar79 + fVar85 * fVar86 + fVar64 * fVar88 + local_3410 * fVar41) *
          fVar80 + (local_3480.v[0] * fVar79 +
                   local_3470 * fVar86 + local_3460 * fVar88 + local_3450 * fVar41) * fVar73) *
         local_3520;
    (pvVar8->field_0).v[1] =
         (fVar43 * (fVar79 * local_33c0.v[1] +
                   fVar86 * local_33b0.v[1] + fVar88 * fStack_339c + fVar41 * fStack_338c) +
          (fStack_33fc * fVar79 + fVar55 * fVar86 + fVar75 * fVar88 + fStack_33cc * fVar41) * fVar84
          + (local_3440.v[1] * fVar79 + fVar91 * fVar86 + fVar47 * fVar88 + fStack_340c * fVar41) *
            fVar80 +
         (local_3480.v[1] * fVar79 +
         fStack_346c * fVar86 + fStack_345c * fVar88 + fStack_344c * fVar41) * fVar73) * local_3520;
    (pvVar8->field_0).v[2] =
         (fVar43 * (fVar79 * local_33c0.v[2] +
                   fVar86 * local_33b0.v[2] + fVar88 * fStack_3398 + fVar41 * fStack_3388) +
          (fStack_33f8 * fVar79 + fVar59 * fVar86 + fVar76 * fVar88 + fStack_33c8 * fVar41) * fVar84
          + (local_3440.v[2] * fVar79 + fVar92 * fVar86 + fVar54 * fVar88 + fStack_3408 * fVar41) *
            fVar80 +
         (local_3480.v[2] * fVar79 +
         fStack_3468 * fVar86 + fStack_3458 * fVar88 + fStack_3448 * fVar41) * fVar73) * local_3520;
    (pvVar8->field_0).v[3] =
         (fVar43 * (fVar79 * local_33c0.v[3] +
                   fVar86 * local_33b0.v[3] + fVar88 * fStack_3394 + fVar41 * fStack_3384) +
          (fStack_33f4 * fVar79 + fVar44 * fVar86 + fVar65 * fVar88 + fStack_33c4 * fVar41) * fVar84
          + (local_3440.v[3] * fVar79 + fVar48 * fVar86 + fVar60 * fVar88 + fStack_3404 * fVar41) *
            fVar80 +
         (local_3480.v[3] * fVar79 +
         fStack_3464 * fVar86 + fStack_3454 * fVar88 + fStack_3444 * fVar41) * fVar73) * local_3520;
    fVar40 = local_33f0;
    fVar55 = fStack_33ec;
    fVar59 = fStack_33e8;
    fVar44 = fStack_33e4;
    fVar85 = local_33e0;
    fVar91 = fStack_33dc;
    fVar92 = fStack_33d8;
    fVar48 = fStack_33d4;
    fVar64 = local_3430;
    fVar47 = fStack_342c;
    fVar54 = fStack_3428;
    fVar60 = fStack_3424;
    fVar72 = local_3420;
    fVar75 = fStack_341c;
    fVar76 = fStack_3418;
    fVar65 = fStack_3414;
    if ((char)iVar32 == '\0') {
      auVar50._0_4_ = fVar39 + fVar42;
      auVar50._4_4_ = fVar42;
      auVar50._8_8_ = 0;
      auVar71._4_4_ = fVar42;
      auVar71._0_4_ = auVar50._0_4_;
      auVar71._8_8_ = 0;
      auVar46 = rcpss(auVar71,auVar50);
      fVar60 = (2.0 - auVar50._0_4_ * auVar46._0_4_) * auVar46._0_4_;
      fVar64 = fVar60 * (local_3380.v[0] * fVar42 + local_3430 * fVar39);
      fVar47 = fVar60 * (local_3380.v[1] * fVar42 + fStack_342c * fVar39);
      fVar54 = fVar60 * (local_3380.v[2] * fVar42 + fStack_3428 * fVar39);
      fVar60 = fVar60 * (local_3380.v[3] * fVar42 + fStack_3424 * fVar39);
      fVar40 = fVar87 + fVar42;
      auVar51._4_4_ = fVar81;
      auVar51._0_4_ = fVar40;
      auVar51._8_8_ = 0;
      auVar16._4_4_ = fVar81;
      auVar16._0_4_ = fVar40;
      auVar16._8_8_ = 0;
      auVar46 = rcpss(auVar51,auVar16);
      fVar65 = (2.0 - fVar40 * auVar46._0_4_) * auVar46._0_4_;
      fVar72 = (local_3420 * fVar42 + local_3370 * fVar87) * fVar65;
      fVar75 = (fStack_341c * fVar42 + fStack_336c * fVar87) * fVar65;
      fVar76 = (fStack_3418 * fVar42 + fStack_3368 * fVar87) * fVar65;
      fVar65 = (fStack_3414 * fVar42 + fStack_3364 * fVar87) * fVar65;
      fVar40 = (2.0 - fVar39) - fVar42;
      auVar46 = rcpss(ZEXT416((uint)fVar40),ZEXT416((uint)fVar40));
      fVar48 = (2.0 - fVar40 * auVar46._0_4_) * auVar46._0_4_;
      fVar85 = fVar48 * (local_3350 * fVar81 + local_33e0 * fVar87);
      fVar91 = fVar48 * (fStack_334c * fVar81 + fStack_33dc * fVar87);
      fVar92 = fVar48 * (fStack_3348 * fVar81 + fStack_33d8 * fVar87);
      fVar48 = fVar48 * (fStack_3344 * fVar81 + fStack_33d4 * fVar87);
      fVar40 = (fVar39 + 1.0) - fVar42;
      auVar46 = rcpss(ZEXT416((uint)fVar40),ZEXT416((uint)fVar40));
      fVar44 = (2.0 - fVar40 * auVar46._0_4_) * auVar46._0_4_;
      fVar40 = (local_33f0 * fVar81 + local_3360 * fVar39) * fVar44;
      fVar55 = (fStack_33ec * fVar81 + fStack_335c * fVar39) * fVar44;
      fVar59 = (fStack_33e8 * fVar81 + fStack_3358 * fVar39) * fVar44;
      fVar44 = (fStack_33e4 * fVar81 + fStack_3354 * fVar39) * fVar44;
    }
    fVar89 = fVar87 * fVar87;
    fVar41 = fVar39 * 3.0 * fVar89;
    fVar93 = fVar39 * fVar39;
    fVar80 = fVar93 * 3.0;
    fVar73 = fVar87 * fVar80;
    fVar79 = fVar87 * fVar89;
    fVar90 = fVar39 * fVar93;
    fVar84 = fVar81 * 6.0;
    fVar43 = (fVar42 - (fVar81 + fVar81)) * 6.0;
    fVar86 = (fVar81 - (fVar42 + fVar42)) * 6.0;
    fVar88 = fVar42 * 6.0;
    (pvVar9->field_0).v[0] =
         (fVar88 * (fVar79 * local_33c0.v[0] +
                   fVar41 * local_33b0.v[0] + fVar73 * local_33a0 + fVar90 * local_3390) +
          (local_3400 * fVar79 + fVar40 * fVar41 + fVar85 * fVar73 + local_33d0 * fVar90) * fVar86 +
          (local_3440.v[0] * fVar79 + fVar64 * fVar41 + fVar72 * fVar73 + local_3410 * fVar90) *
          fVar43 + (local_3480.v[0] * fVar79 +
                   local_3470 * fVar41 + local_3460 * fVar73 + local_3450 * fVar90) * fVar84) *
         local_3520;
    (pvVar9->field_0).v[1] =
         (fVar88 * (fVar79 * local_33c0.v[1] +
                   fVar41 * local_33b0.v[1] + fVar73 * fStack_339c + fVar90 * fStack_338c) +
          (fStack_33fc * fVar79 + fVar55 * fVar41 + fVar91 * fVar73 + fStack_33cc * fVar90) * fVar86
          + (local_3440.v[1] * fVar79 + fVar47 * fVar41 + fVar75 * fVar73 + fStack_340c * fVar90) *
            fVar43 +
         (local_3480.v[1] * fVar79 +
         fStack_346c * fVar41 + fStack_345c * fVar73 + fStack_344c * fVar90) * fVar84) * local_3520;
    (pvVar9->field_0).v[2] =
         (fVar88 * (fVar79 * local_33c0.v[2] +
                   fVar41 * local_33b0.v[2] + fVar73 * fStack_3398 + fVar90 * fStack_3388) +
          (fStack_33f8 * fVar79 + fVar59 * fVar41 + fVar92 * fVar73 + fStack_33c8 * fVar90) * fVar86
          + (local_3440.v[2] * fVar79 + fVar54 * fVar41 + fVar76 * fVar73 + fStack_3408 * fVar90) *
            fVar43 +
         (local_3480.v[2] * fVar79 +
         fStack_3468 * fVar41 + fStack_3458 * fVar73 + fStack_3448 * fVar90) * fVar84) * local_3520;
    (pvVar9->field_0).v[3] =
         (fVar88 * (fVar79 * local_33c0.v[3] +
                   fVar41 * local_33b0.v[3] + fVar73 * fStack_3394 + fVar90 * fStack_3384) +
          (fStack_33f4 * fVar79 + fVar44 * fVar41 + fVar48 * fVar73 + fStack_33c4 * fVar90) * fVar86
          + (local_3440.v[3] * fVar79 + fVar60 * fVar41 + fVar65 * fVar73 + fStack_3404 * fVar90) *
            fVar43 +
         (local_3480.v[3] * fVar79 +
         fStack_3464 * fVar41 + fStack_3454 * fVar73 + fStack_3444 * fVar90) * fVar84) * local_3520;
    if ((char)iVar32 == '\0') {
      auVar52._0_4_ = fVar39 + fVar42;
      auVar52._4_4_ = fVar42;
      auVar52._8_8_ = 0;
      auVar58._4_4_ = fVar42;
      auVar58._0_4_ = auVar52._0_4_;
      auVar58._8_8_ = 0;
      auVar46 = rcpss(auVar58,auVar52);
      fVar40 = (2.0 - auVar52._0_4_ * auVar46._0_4_) * auVar46._0_4_;
      local_3430 = fVar40 * (local_3380.v[0] * fVar42 + local_3430 * fVar39);
      fStack_342c = fVar40 * (local_3380.v[1] * fVar42 + fStack_342c * fVar39);
      fStack_3428 = fVar40 * (local_3380.v[2] * fVar42 + fStack_3428 * fVar39);
      fStack_3424 = fVar40 * (local_3380.v[3] * fVar42 + fStack_3424 * fVar39);
      fVar40 = fVar87 + fVar42;
      auVar53._4_4_ = fVar81;
      auVar53._0_4_ = fVar40;
      auVar53._8_8_ = 0;
      auVar17._4_4_ = fVar81;
      auVar17._0_4_ = fVar40;
      auVar17._8_8_ = 0;
      auVar46 = rcpss(auVar53,auVar17);
      fVar40 = (2.0 - fVar40 * auVar46._0_4_) * auVar46._0_4_;
      local_3420 = (local_3420 * fVar42 + local_3370 * fVar87) * fVar40;
      fStack_341c = (fStack_341c * fVar42 + fStack_336c * fVar87) * fVar40;
      fStack_3418 = (fStack_3418 * fVar42 + fStack_3368 * fVar87) * fVar40;
      fStack_3414 = (fStack_3414 * fVar42 + fStack_3364 * fVar87) * fVar40;
      fVar40 = (2.0 - fVar39) - fVar42;
      auVar46 = rcpss(ZEXT416((uint)fVar40),ZEXT416((uint)fVar40));
      fVar40 = (2.0 - fVar40 * auVar46._0_4_) * auVar46._0_4_;
      local_33e0 = fVar40 * (local_3350 * fVar81 + local_33e0 * fVar87);
      fStack_33dc = fVar40 * (fStack_334c * fVar81 + fStack_33dc * fVar87);
      fStack_33d8 = fVar40 * (fStack_3348 * fVar81 + fStack_33d8 * fVar87);
      fStack_33d4 = fVar40 * (fStack_3344 * fVar81 + fStack_33d4 * fVar87);
      fVar40 = (fVar39 + 1.0) - fVar42;
      auVar46 = rcpss(ZEXT416((uint)fVar40),ZEXT416((uint)fVar40));
      fVar40 = (2.0 - fVar40 * auVar46._0_4_) * auVar46._0_4_;
      local_33f0 = (local_33f0 * fVar81 + fVar39 * local_3360) * fVar40;
      fStack_33ec = (fStack_33ec * fVar81 + fVar39 * fStack_335c) * fVar40;
      fStack_33e8 = (fStack_33e8 * fVar81 + fVar39 * fStack_3358) * fVar40;
      fStack_33e4 = (fStack_33e4 * fVar81 + fVar39 * fStack_3354) * fVar40;
    }
    fVar40 = fVar39 * fVar87 + fVar39 * fVar87;
    fVar59 = fVar89 * -3.0;
    fVar39 = (fVar89 - fVar40) * 3.0;
    fVar40 = (fVar40 - fVar93) * 3.0;
    fVar44 = fVar42 * fVar81 + fVar42 * fVar81;
    fVar55 = fVar77 * -3.0;
    fVar42 = (fVar77 - fVar44) * 3.0;
    fVar44 = (fVar44 - fVar61) * 3.0;
    (pvVar10->field_0).v[0] =
         local_3520 *
         (fVar78 * (fVar59 * local_33c0.v[0] +
                   fVar39 * local_33b0.v[0] + fVar40 * local_33a0 + fVar80 * local_3390) +
          (local_3400 * fVar59 + local_33f0 * fVar39 + local_33e0 * fVar40 + local_33d0 * fVar80) *
          fVar44 + (local_3440.v[0] * fVar59 +
                   local_3430 * fVar39 + local_3420 * fVar40 + local_3410 * fVar80) * fVar42 +
         (local_3480.v[0] * fVar59 + local_3470 * fVar39 + local_3460 * fVar40 + local_3450 * fVar80
         ) * fVar55);
    (pvVar10->field_0).v[1] =
         local_3520 *
         (fVar78 * (fVar59 * local_33c0.v[1] +
                   fVar39 * local_33b0.v[1] + fVar40 * fStack_339c + fVar80 * fStack_338c) +
          (fStack_33fc * fVar59 + fStack_33ec * fVar39 + fStack_33dc * fVar40 + fStack_33cc * fVar80
          ) * fVar44 +
          (local_3440.v[1] * fVar59 +
          fStack_342c * fVar39 + fStack_341c * fVar40 + fStack_340c * fVar80) * fVar42 +
         (local_3480.v[1] * fVar59 +
         fStack_346c * fVar39 + fStack_345c * fVar40 + fStack_344c * fVar80) * fVar55);
    (pvVar10->field_0).v[2] =
         local_3520 *
         (fVar78 * (fVar59 * local_33c0.v[2] +
                   fVar39 * local_33b0.v[2] + fVar40 * fStack_3398 + fVar80 * fStack_3388) +
          (fStack_33f8 * fVar59 + fStack_33e8 * fVar39 + fStack_33d8 * fVar40 + fStack_33c8 * fVar80
          ) * fVar44 +
          (local_3440.v[2] * fVar59 +
          fStack_3428 * fVar39 + fStack_3418 * fVar40 + fStack_3408 * fVar80) * fVar42 +
         (local_3480.v[2] * fVar59 +
         fStack_3468 * fVar39 + fStack_3458 * fVar40 + fStack_3448 * fVar80) * fVar55);
    (pvVar10->field_0).v[3] =
         local_3520 *
         (fVar78 * (fVar59 * local_33c0.v[3] +
                   fVar39 * local_33b0.v[3] + fVar40 * fStack_3394 + fVar80 * fStack_3384) +
          (fStack_33f4 * fVar59 + fStack_33e4 * fVar39 + fStack_33d4 * fVar40 + fStack_33c4 * fVar80
          ) * fVar44 +
          (local_3440.v[3] * fVar59 +
          fStack_3424 * fVar39 + fStack_3414 * fVar40 + fStack_3404 * fVar80) * fVar42 +
         (local_3480.v[3] * fVar59 +
         fStack_3464 * fVar39 + fStack_3454 * fVar40 + fStack_3444 * fVar80) * fVar55);
    return;
  }
LAB_00d4d965:
  BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::init
            ((BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_3480,
             (EVP_PKEY_CTX *)patch);
  BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
            ((BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_3480,
             (uv->field_0).field_0.x,(uv->field_0).field_0.y,this->P,this->dPdu,this->dPdv,
             this->ddPdudu,this->ddPdvdv,this->ddPdudv,local_3520);
  return;
}

Assistant:

void eval(CatmullClarkPatch& patch, Vec2f uv, float dscale, size_t depth, 
                  BezierCurve* border0 = nullptr, BezierCurve* border1 = nullptr, BezierCurve* border2 = nullptr, BezierCurve* border3 = nullptr)
        {
          while (true) 
          {
            typename CatmullClarkPatch::Type ty = patch.type();

            if (unlikely(final(patch,ty,depth)))
            {
              if (ty & CatmullClarkRing::TYPE_REGULAR) { 
                RegularPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
                PATCH_DEBUG_SUBDIVISION(234423,c,c,-1);
                return;
              } else {
                IrregularFillPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
                PATCH_DEBUG_SUBDIVISION(34534,c,-1,c);
                return;
              }
            }
            else if (ty & CatmullClarkRing::TYPE_REGULAR_CREASES) { 
              assert(depth > 0); 
              RegularPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
              PATCH_DEBUG_SUBDIVISION(43524,c,c,-1);
              return;
            }
#if PATCH_USE_GREGORY == 2
            else if (ty & CatmullClarkRing::TYPE_GREGORY_CREASES) { 
              assert(depth > 0); 
              GregoryPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
              PATCH_DEBUG_SUBDIVISION(23498,c,-1,c);
              return;
            }
#endif
            else
            {
              array_t<CatmullClarkPatch,4> patches; 
              patch.subdivide(patches); // FIXME: only have to generate one of the patches
              
              const float u = uv.x, v = uv.y;
              if (v < 0.5f) {
                if (u < 0.5f) { patch = patches[0]; uv = Vec2f(2.0f*u,2.0f*v); dscale *= 2.0f; }
                else          { patch = patches[1]; uv = Vec2f(2.0f*u-1.0f,2.0f*v); dscale *= 2.0f; }
              } else {
                if (u > 0.5f) { patch = patches[2]; uv = Vec2f(2.0f*u-1.0f,2.0f*v-1.0f); dscale *= 2.0f; }
                else          { patch = patches[3]; uv = Vec2f(2.0f*u,2.0f*v-1.0f); dscale *= 2.0f; }
              }
              depth++;
            }
          }